

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitLir.c
# Opt level: O2

void sljit_free_compiler(sljit_compiler *compiler)

{
  void *pvVar1;
  sljit_memory_fragment *psVar2;
  sljit_memory_fragment *psVar3;
  pcre2_memctl *allocator;
  
  pvVar1 = compiler->allocator_data;
  psVar3 = compiler->buf;
  while (psVar3 != (sljit_memory_fragment *)0x0) {
    psVar2 = psVar3->next;
    (**(code **)((long)pvVar1 + 8))(psVar3,*(undefined8 *)((long)pvVar1 + 0x10));
    psVar3 = psVar2;
  }
  psVar3 = compiler->abuf;
  while (psVar3 != (sljit_memory_fragment *)0x0) {
    psVar2 = psVar3->next;
    (**(code **)((long)pvVar1 + 8))(psVar3,*(undefined8 *)((long)pvVar1 + 0x10));
    psVar3 = psVar2;
  }
  (**(code **)((long)pvVar1 + 8))(compiler,*(undefined8 *)((long)pvVar1 + 0x10));
  return;
}

Assistant:

SLJIT_API_FUNC_ATTRIBUTE void sljit_free_compiler(struct sljit_compiler *compiler)
{
	struct sljit_memory_fragment *buf;
	struct sljit_memory_fragment *curr;
	void *allocator_data = compiler->allocator_data;
	SLJIT_UNUSED_ARG(allocator_data);

	buf = compiler->buf;
	while (buf) {
		curr = buf;
		buf = buf->next;
		SLJIT_FREE(curr, allocator_data);
	}

	buf = compiler->abuf;
	while (buf) {
		curr = buf;
		buf = buf->next;
		SLJIT_FREE(curr, allocator_data);
	}

#if (defined SLJIT_CONFIG_ARM_V5 && SLJIT_CONFIG_ARM_V5)
	SLJIT_FREE(compiler->cpool, allocator_data);
#endif
	SLJIT_FREE(compiler, allocator_data);
}